

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O3

void __thiscall QTipLabel::~QTipLabel(QTipLabel *this)

{
  *(undefined ***)&(this->super_QLabel).super_QFrame.super_QWidget = &PTR_metaObject_007eca48;
  *(undefined ***)&(this->super_QLabel).super_QFrame.super_QWidget.super_QPaintDevice =
       &PTR__QTipLabel_007ecc00;
  instance = (QTipLabel *)0x0;
  if ((this->expireTimer).m_id != Invalid) {
    QBasicTimer::stop();
  }
  if ((this->hideTimer).m_id != Invalid) {
    QBasicTimer::stop();
  }
  QLabel::~QLabel(&this->super_QLabel);
  return;
}

Assistant:

QTipLabel::~QTipLabel()
{
    instance = nullptr;
}